

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void pybind11::detail::add_class_method(object *cls,char *name_,cpp_function *cf)

{
  handle obj;
  bool bVar1;
  int iVar2;
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>> local_70 [8]
  ;
  PyObject *local_68;
  object local_60;
  object local_58;
  char *local_50;
  handle local_48;
  object *local_40;
  object local_38;
  
  local_50 = name_;
  cpp_function::name((cpp_function *)&local_48);
  obj.m_ptr = (cls->super_handle).m_ptr;
  if (local_48.m_ptr != (PyObject *)0x0) {
    (local_48.m_ptr)->ob_refcnt = (local_48.m_ptr)->ob_refcnt + 1;
  }
  local_60.super_handle.m_ptr = (handle)(handle)local_48.m_ptr;
  local_38.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_68 = obj.m_ptr;
  local_40 = cls;
  object::~object(&local_38);
  accessor_policies::obj_attr::set
            (obj,local_48,(cf->super_function).super_object.super_handle.m_ptr);
  object::~object(&local_58);
  object::~object(&local_60);
  object::~object((object *)&local_48);
  iVar2 = strcmp(local_50,"__eq__");
  if (iVar2 == 0) {
    local_68 = (local_40->super_handle).m_ptr;
    local_60.super_handle.m_ptr = (handle)(PyObject *)0x3fbb1f;
    local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
    bVar1 = object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
            contains<char_const(&)[9]>(local_70,(char (*) [9])"__hash__");
    object::~object(&local_58);
    if (!bVar1) {
      local_38.super_handle.m_ptr = (handle)&_Py_NoneStruct;
      __Py_NoneStruct = __Py_NoneStruct + 1;
      local_68 = (local_40->super_handle).m_ptr;
      local_60.super_handle.m_ptr = (handle)(PyObject *)0x3fbb28;
      local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
      accessor_policies::str_attr::set((handle)local_68,"__hash__",(PyObject *)&_Py_NoneStruct);
      object::~object(&local_58);
      object::~object(&local_38);
    }
  }
  return;
}

Assistant:

inline void add_class_method(object& cls, const char *name_, const cpp_function &cf) {
    cls.attr(cf.name()) = cf;
    if (strcmp(name_, "__eq__") == 0 && !cls.attr("__dict__").contains("__hash__")) {
      cls.attr("__hash__") = none();
    }
}